

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
upb::generator::FileWarning_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view filename)

{
  string_view value;
  Arg *in_R8;
  string_view format;
  Arg local_60;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  generator *local_20;
  string_view filename_local;
  
  filename_local._M_len = filename._M_len;
  local_20 = this;
  filename_local._M_str = (char *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "/* This file was generated by upb_generator from the input file:\n *\n *     $0\n *\n * Do not edit -- your changes will be discarded when the file is\n * regenerated.\n * NO CHECKED-IN PROTOBUF GENCODE */\n\n"
            );
  value._M_str = (char *)filename_local._M_len;
  value._M_len = (size_t)local_20;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_60,value);
  format._M_str = (char *)&local_60;
  format._M_len = (size_t)local_30._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_30._M_len,format,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string FileWarning(absl::string_view filename) {
  return absl::Substitute(
      "/* This file was generated by upb_generator from the input file:\n"
      " *\n"
      " *     $0\n"
      " *\n"
      " * Do not edit -- your changes will be discarded when the file is\n"
      " * regenerated.\n"
      " * NO CHECKED-IN "
      // Intentional line break.
      "PROTOBUF GENCODE */\n"
      "\n",
      filename);
}